

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O0

void __thiscall arm::ConstValue::~ConstValue(ConstValue *this)

{
  void *in_RDI;
  
  ~ConstValue((ConstValue *)0x2c74e8);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

virtual ~ConstValue() {}